

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O3

void rr::pa::TriangleStripAdjacency::
     exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
               (__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  long lVar1;
  undefined1 auVar2 [16];
  VertexPacket *pVVar3;
  VertexPacket *pVVar4;
  VertexPacket *pVVar5;
  VertexPacket *pVVar6;
  VertexPacket *pVVar7;
  TriangleAdjacency *pTVar8;
  VertexPacket **ppVVar9;
  VertexPacket **ppVVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  VertexPacket **ppVVar14;
  VertexPacket **ppVVar15;
  VertexPacket **ppVVar16;
  VertexPacket **ppVVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (numVertices < 6) {
    return;
  }
  if (7 < numVertices) {
    pVVar3 = vertices[2];
    pVVar4 = vertices[6];
    iVar12 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) << 2;
    pVVar5 = vertices[1];
    auVar2 = *(undefined1 (*) [16])(vertices + 3);
    (outputIterator._M_current)->v0 = *vertices;
    (outputIterator._M_current)->v1 = pVVar5;
    (outputIterator._M_current)->v2 = pVVar3;
    (outputIterator._M_current)->v3 = pVVar4;
    auVar19._0_8_ = auVar2._8_8_;
    auVar19._8_4_ = auVar2._0_4_;
    auVar19._12_4_ = auVar2._4_4_;
    (outputIterator._M_current)->v4 = (VertexPacket *)auVar19._0_8_;
    (outputIterator._M_current)->v5 = (VertexPacket *)auVar19._8_8_;
    (outputIterator._M_current)->provokingIndex = iVar12;
    pTVar8 = outputIterator._M_current + 1;
    uVar13 = 1;
    if (5 < numVertices - 4) {
      ppVVar14 = vertices;
      do {
        ppVVar9 = ppVVar14;
        outputIterator._M_current = pTVar8;
        if ((uVar13 & 1) == 0) {
          ppVVar14 = ppVVar9 + 2;
          ppVVar10 = ppVVar9 + 8;
          ppVVar15 = ppVVar9 + 5;
          ppVVar16 = ppVVar14;
          ppVVar17 = ppVVar9 + 4;
          iVar11 = iVar12;
        }
        else {
          ppVVar16 = vertices + uVar13 * 2;
          ppVVar14 = vertices + uVar13 * 2 + 2;
          ppVVar10 = vertices + uVar13 * 2 + 3;
          ppVVar15 = vertices + uVar13 * 2 + 6;
          ppVVar17 = ppVVar16;
          iVar11 = (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) * 2 + 2;
        }
        pVVar3 = *ppVVar15;
        pVVar4 = ppVVar16[-2];
        pVVar5 = ppVVar16[4];
        pVVar6 = *ppVVar10;
        pVVar7 = *ppVVar17;
        (outputIterator._M_current)->v0 = *ppVVar14;
        (outputIterator._M_current)->v1 = pVVar4;
        (outputIterator._M_current)->v2 = pVVar7;
        (outputIterator._M_current)->v3 = pVVar6;
        (outputIterator._M_current)->v4 = pVVar5;
        (outputIterator._M_current)->v5 = pVVar3;
        (outputIterator._M_current)->provokingIndex = iVar11;
        pTVar8 = outputIterator._M_current + 1;
        lVar1 = uVar13 - (numVertices - 4 >> 1);
        uVar13 = uVar13 + 1;
        ppVVar14 = ppVVar9 + 2;
      } while (lVar1 != -2);
      if ((uVar13 & 1) == 0) {
        pVVar3 = ppVVar9[2];
        pVVar4 = ppVVar9[6];
        pVVar5 = ppVVar9[7];
        auVar2 = *(undefined1 (*) [16])(ppVVar9 + 8);
        pTVar8->v0 = ppVVar9[4];
        outputIterator._M_current[1].v1 = pVVar3;
        outputIterator._M_current[1].v2 = pVVar4;
        auVar20._0_8_ = auVar2._8_8_;
        auVar20._8_4_ = auVar2._0_4_;
        auVar20._12_4_ = auVar2._4_4_;
        outputIterator._M_current[1].v3 = (VertexPacket *)auVar20._0_8_;
        outputIterator._M_current[1].v4 = (VertexPacket *)auVar20._8_8_;
        outputIterator._M_current[1].v5 = pVVar5;
        outputIterator._M_current[1].provokingIndex = iVar12;
        return;
      }
    }
    pVVar3 = vertices[uVar13 * 2 + -2];
    pVVar4 = vertices[uVar13 * 2];
    pVVar5 = vertices[uVar13 * 2 + 5];
    pVVar6 = vertices[uVar13 * 2 + 3];
    pVVar7 = (vertices + uVar13 * 2 + 3)[1];
    pTVar8->v0 = vertices[uVar13 * 2 + 2];
    outputIterator._M_current[1].v1 = pVVar3;
    outputIterator._M_current[1].v2 = pVVar4;
    outputIterator._M_current[1].v3 = pVVar6;
    outputIterator._M_current[1].v4 = pVVar7;
    outputIterator._M_current[1].v5 = pVVar5;
    outputIterator._M_current[1].provokingIndex =
         (provokingConvention != PROVOKINGVERTEX_FIRST) + 2 +
         (uint)(provokingConvention != PROVOKINGVERTEX_FIRST);
    return;
  }
  pVVar3 = vertices[2];
  pVVar4 = vertices[3];
  pVVar5 = vertices[1];
  auVar2 = *(undefined1 (*) [16])(vertices + 4);
  (outputIterator._M_current)->v0 = *vertices;
  (outputIterator._M_current)->v1 = pVVar5;
  (outputIterator._M_current)->v2 = pVVar3;
  auVar18._0_8_ = auVar2._8_8_;
  auVar18._8_4_ = auVar2._0_4_;
  auVar18._12_4_ = auVar2._4_4_;
  (outputIterator._M_current)->v3 = (VertexPacket *)auVar18._0_8_;
  (outputIterator._M_current)->v4 = (VertexPacket *)auVar18._8_8_;
  (outputIterator._M_current)->v5 = pVVar4;
  (outputIterator._M_current)->provokingIndex =
       (uint)(provokingConvention != PROVOKINGVERTEX_FIRST) << 2;
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices < 6)
		{
		}
		else if (numVertices < 8)
		{
			*(outputIterator++) = TriangleAdjacency(vertices[0], vertices[1], vertices[2], vertices[5], vertices[4], vertices[3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
		}
		else
		{
			const size_t primitiveCount = getPrimitiveCount(numVertices);
			size_t i;

			// first
			*(outputIterator++) = TriangleAdjacency(vertices[0], vertices[1], vertices[2], vertices[6], vertices[4], vertices[3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));

			// middle
			for (i = 1; i + 1 < primitiveCount; ++i)
			{
				// odd
				if (i % 2 == 1)
				{
					*(outputIterator++) = TriangleAdjacency(vertices[2*i+2], vertices[2*i-2], vertices[2*i+0], vertices[2*i+3], vertices[2*i+4], vertices[2*i+6], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (2) : (4));
				}
				// even
				else
				{
					*(outputIterator++) = TriangleAdjacency(vertices[2*i+0], vertices[2*i-2], vertices[2*i+2], vertices[2*i+6], vertices[2*i+4], vertices[2*i+3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
				}
			}

			// last

			// odd
			if (i % 2 == 1)
				*(outputIterator++) = TriangleAdjacency(vertices[2*i+2], vertices[2*i-2], vertices[2*i+0], vertices[2*i+3], vertices[2*i+4], vertices[2*i+5], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (2) : (4));
			// even
			else
				*(outputIterator++) = TriangleAdjacency(vertices[2*i+0], vertices[2*i-2], vertices[2*i+2], vertices[2*i+5], vertices[2*i+4], vertices[2*i+3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
		}
	}